

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::addNewDataLocation(Union *this,uint lgSize)

{
  DataLocation local_20;
  uint local_18;
  uint local_14;
  uint offset;
  uint lgSize_local;
  Union *this_local;
  
  local_14 = lgSize;
  _offset = this;
  local_20.offset = (*this->parent->_vptr_StructOrGroup[1])(this->parent,(ulong)lgSize);
  local_20.lgSize = local_14;
  local_18 = local_20.offset;
  kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
  add<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>
            (&this->dataLocations,&local_20);
  return local_18;
}

Assistant:

uint addNewDataLocation(uint lgSize) {
      // Add a whole new data location to the union with the given size.

      uint offset = parent.addData(lgSize);
      dataLocations.add(DataLocation { lgSize, offset });
      return offset;
    }